

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cc
# Opt level: O3

size_t OB::String::damerau_levenshtein
                 (string *lhs,string *rhs,size_t weight_insert,size_t weight_substitute,
                 size_t weight_delete,size_t weight_transpose)

{
  undefined1 auVar1 [8];
  undefined1 auVar2 [8];
  undefined1 auVar3 [8];
  pointer puVar4;
  pointer puVar5;
  int iVar6;
  pointer pcVar7;
  unsigned_long uVar8;
  undefined8 uVar9;
  pointer pcVar10;
  pointer pcVar11;
  pointer pcVar12;
  pointer pcVar13;
  pointer pcVar14;
  pointer extraout_RDX;
  size_t sVar15;
  pointer pcVar16;
  pointer puVar17;
  ulong uVar18;
  pointer __s2;
  pointer pcVar19;
  pointer __s1;
  bool bVar20;
  value_type_conflict1 local_118;
  size_t local_110;
  long local_108;
  size_t local_100;
  pointer local_d8;
  pointer local_d0;
  pointer local_c8;
  long local_c0;
  pointer local_b8;
  pointer local_b0;
  undefined1 local_a0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> v0;
  pointer local_80;
  pointer local_78;
  undefined1 local_70 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> v2;
  allocator_type local_31;
  
  pcVar12 = (pointer)lhs->_M_string_length;
  pcVar14 = (pointer)rhs->_M_string_length;
  local_110 = weight_substitute;
  local_100 = weight_transpose;
  v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)weight_insert;
  if (pcVar12 == pcVar14) {
    if (pcVar12 != (pointer)0x0) {
      __s2 = (rhs->_M_dataplus)._M_p;
      __s1 = (lhs->_M_dataplus)._M_p;
      iVar6 = bcmp(__s1,__s2,(size_t)pcVar12);
      if (iVar6 != 0) goto LAB_00123bd8;
    }
    sVar15 = 0;
  }
  else {
    __s1 = (lhs->_M_dataplus)._M_p;
    __s2 = (rhs->_M_dataplus)._M_p;
LAB_00123bd8:
    pcVar7 = pcVar12;
    pcVar11 = __s1;
    pcVar19 = pcVar14;
    if (pcVar14 < pcVar12) {
      pcVar7 = pcVar14;
      pcVar11 = __s2;
      __s2 = __s1;
      pcVar19 = pcVar12;
    }
    if (pcVar7 != (pointer)0x0) {
      pcVar13 = (pointer)0x1;
      do {
        pcVar16 = pcVar19;
        if ((long)pcVar13 - (long)pcVar19 == 1) goto LAB_0012402a;
        pcVar10 = pcVar7;
      } while (((pcVar11 + -1)[(long)pcVar13] == (__s2 + -1)[(long)pcVar13]) &&
              (bVar20 = pcVar13 < pcVar7, pcVar13 = pcVar13 + 1, bVar20));
      do {
        pcVar16 = pcVar16 + -1;
        pcVar10 = pcVar10 + -1;
        if (pcVar19 <= pcVar16) goto LAB_0012402a;
      } while ((pcVar11[(long)pcVar10] == __s2[(long)pcVar16]) && (pcVar10 != (pointer)0x0));
    }
    __s1 = pcVar19;
    pcVar13 = pcVar11;
    if (pcVar14 < pcVar12) {
      __s1 = pcVar7;
      pcVar13 = __s2;
      __s2 = pcVar11;
      pcVar7 = pcVar19;
    }
    if (pcVar7 == (pointer)0x0) {
      sVar15 = (long)__s1 *
               (long)v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
    }
    else if (__s1 == (pointer)0x0) {
      sVar15 = (long)pcVar7 * weight_delete;
    }
    else {
      pcVar12 = __s1 + 1;
      v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a0,
                 (size_type)pcVar12,
                 (value_type_conflict1 *)
                 &v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(allocator_type *)local_70);
      local_70 = (undefined1  [8])0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(size_type)pcVar12,
                 (value_type_conflict1 *)local_70,(allocator_type *)&local_118);
      local_118 = 0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_70,
                 (size_type)pcVar12,&local_118,&local_31);
      pcVar14 = (pointer)((long)local_80 -
                          (long)v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage >> 3);
      uVar8 = 0;
      pcVar11 = (pointer)0x0;
      do {
        if (pcVar14 == pcVar11) goto LAB_00124034;
        v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage[(long)pcVar11] = uVar8;
        pcVar11 = pcVar11 + 1;
        uVar8 = uVar8 + (long)v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage;
      } while (pcVar12 != pcVar11);
      local_108 = -(long)__s1;
      pcVar12 = (pointer)0x0;
      auVar2 = local_a0;
      puVar17 = v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish;
      auVar3 = (undefined1  [8])
               v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      puVar4 = local_78;
      puVar5 = v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      do {
        v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar5;
        local_78 = puVar4;
        v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)auVar3;
        v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar17;
        local_a0 = auVar2;
        puVar17 = local_80;
        local_80 = v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
        auVar3 = local_70;
        auVar1 = local_a0;
        pcVar14 = (pointer)((long)v2.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start - (long)local_70 >> 3);
        local_c8 = pcVar7;
        local_b8 = __s1;
        if ((undefined1  [8])
            v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start == local_70) goto LAB_00124045;
        local_d8 = pcVar12 + 1;
        pcVar11 = (pointer)((long)local_d8 * weight_delete);
        *(pointer *)local_70 = pcVar11;
        local_c0 = (long)puVar17 -
                   (long)v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage >> 3;
        local_d0 = v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
        local_b0 = (pointer)((long)v0.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start - (long)local_a0 >> 3);
        pcVar19 = (pointer)0x1;
        pcVar16 = pcVar7;
        do {
          if ((pointer)(local_c0 + (ulong)(local_c0 == 0)) == pcVar19) {
LAB_00123fe7:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       pcVar19,local_c0);
LAB_00123fff:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       pcVar19,local_b0);
            __s1 = (pointer)-(long)pcVar14;
            pcVar19 = pcVar16;
            goto LAB_0012402a;
          }
          pcVar16 = (pointer)-(long)pcVar14 + (long)pcVar19;
          if (pcVar16 == (pointer)0x1) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       pcVar14);
LAB_00123fd2:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       pcVar19,pcVar14);
            goto LAB_00123fe7;
          }
          if (pcVar14 + (pcVar14 == (pointer)0x0) == pcVar19) goto LAB_00123fd2;
          pcVar16 = (pointer)(v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage[(long)pcVar19] +
                             weight_delete);
          sVar15 = local_110;
          if (pcVar13[(long)pcVar12] == (__s2 + -1)[(long)pcVar19]) {
            sVar15 = 0;
          }
          pcVar10 = pcVar11 + (long)v2.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          if ((pointer)(sVar15 + v0.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage
                                 [(long)(pcVar19 + -1)]) <
              pcVar11 + (long)v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            pcVar10 = (pointer)(sVar15 + v0.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage
                                         [(long)(pcVar19 + -1)]);
          }
          pcVar11 = pcVar10;
          if (pcVar16 <= pcVar10) {
            pcVar11 = pcVar16;
          }
          *(pointer *)((long)local_70 + pcVar19 * 8) = pcVar11;
          if (((pcVar19 != (pointer)0x1 && pcVar12 != (pointer)0x0) &&
              ((pcVar13 + -1)[(long)pcVar12] == (__s2 + -1)[(long)pcVar19])) &&
             (pcVar13[(long)pcVar12] == (__s2 + -2)[(long)pcVar19])) {
            if (pcVar19 < local_b0) {
              pcVar11 = (pointer)(*(pointer)((long)local_a0 + (pcVar19 + -2) * 8) + local_100);
              if (*(pointer *)((long)local_a0 + pcVar19 * 8) <=
                  (pointer)(*(pointer)((long)local_a0 + (pcVar19 + -2) * 8) + local_100)) {
                pcVar11 = *(pointer *)((long)local_a0 + pcVar19 * 8);
              }
              *(pointer *)((long)local_70 + pcVar19 * 8) = pcVar11;
              goto LAB_00123ea2;
            }
            goto LAB_00123fff;
          }
LAB_00123ea2:
          bVar20 = pcVar19 != __s1;
          pcVar19 = pcVar19 + 1;
        } while (bVar20);
        local_70 = local_a0;
        v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        pcVar12 = local_d8;
        auVar2 = (undefined1  [8])
                 v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = puVar17;
        puVar17 = local_78;
        puVar4 = v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        puVar5 = v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      } while (local_d8 != pcVar7);
      auVar2 = (undefined1  [8])
               v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      puVar17 = local_78;
      puVar4 = v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar5 = v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pcVar14 <= __s1) {
LAB_00124058:
        v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar5;
        local_78 = puVar4;
        v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)auVar3;
        v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar17;
        local_a0 = auVar2;
        uVar9 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,__s1);
        if (local_70 != (undefined1  [8])0x0) {
          operator_delete((void *)local_70,
                          (long)v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)local_70);
        }
        if (v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          operator_delete(v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (long)local_78 -
                          (long)v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        if (local_a0 != (undefined1  [8])0x0) {
          operator_delete((void *)local_a0,
                          (long)v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)local_a0);
        }
        _Unwind_Resume(uVar9);
      }
      sVar15 = *(size_t *)((long)auVar3 + __s1 * 8);
      auVar2 = (undefined1  [8])
               v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      puVar17 = local_78;
      if ((local_a0 == (undefined1  [8])0x0) ||
         (uVar18 = (long)v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)local_a0,
         local_a0 = (undefined1  [8])
                    v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
         v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = local_78,
         v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage = (pointer)auVar3,
         operator_delete((void *)auVar1,uVar18), auVar2 = local_a0,
         puVar17 = v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish,
         auVar3 = (undefined1  [8])
                  v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
         v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage != (pointer)0x0)) {
        v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)auVar3;
        v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar17;
        local_a0 = auVar2;
        operator_delete(v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                        .super__Vector_impl_data._M_end_of_storage,
                        (long)v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      if (local_a0 != (undefined1  [8])0x0) {
        operator_delete((void *)local_a0,
                        (long)v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)local_a0);
      }
    }
  }
  return sVar15;
LAB_0012402a:
  std::__throw_out_of_range_fmt
            ("basic_string_view::at: __pos (which is %zu) >= this->size() (which is %zu)",pcVar16,
             pcVar19);
  pcVar14 = extraout_RDX;
LAB_00124034:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",pcVar14);
  pcVar14 = __s1;
LAB_00124045:
  __s1 = pcVar14;
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,__s1);
  auVar2 = local_a0;
  puVar17 = v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish;
  auVar3 = (undefined1  [8])
           v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  puVar4 = local_78;
  puVar5 = v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  goto LAB_00124058;
}

Assistant:

std::size_t damerau_levenshtein(std::string const& lhs, std::string const& rhs,
  std::size_t const weight_insert, std::size_t const weight_substitute,
  std::size_t const weight_delete, std::size_t const weight_transpose)
{
  if (lhs == rhs)
  {
    return 0;
  }

  std::string_view lhsv {lhs};
  std::string_view rhsv {rhs};

  bool swapped {false};
  if (lhsv.size() > rhsv.size())
  {
    swapped = true;
    std::swap(lhsv, rhsv);
  }

  for (std::size_t i = 0; i < lhsv.size(); ++i)
  {
    if (lhsv.at(i) != rhsv.at(i))
    {
      if (i)
      {
        lhsv.substr(i);
        rhsv.substr(i);
      }

      break;
    }
  }

  for (std::size_t i = 0; i < lhsv.size(); ++i)
  {
    if (lhsv.at(lhsv.size() - 1 - i) != rhsv.at(rhsv.size() - 1 - i))
    {
      if (i)
      {
        lhsv.substr(0, lhsv.size() - 1 - i);
        rhsv.substr(0, rhsv.size() - 1 - i);
      }

      break;
    }
  }

  if (swapped)
  {
    std::swap(lhsv, rhsv);
  }

  if (lhsv.empty())
  {
    return rhsv.size() * weight_insert;
  }

  if (rhsv.empty())
  {
    return lhsv.size() * weight_delete;
  }

  std::vector<std::size_t> v0 (rhsv.size() + 1, 0);
  std::vector<std::size_t> v1 (rhsv.size() + 1, 0);
  std::vector<std::size_t> v2 (rhsv.size() + 1, 0);

  for (std::size_t i = 0; i <= rhsv.size(); ++i)
  {
    v1.at(i) = i * weight_insert;
  }

  for (std::size_t i = 0; i < lhsv.size(); ++i)
  {
    v2.at(0) = (i + 1) * weight_delete;
    for (std::size_t j = 0; j < rhsv.size(); j++)
    {
      v2.at(j + 1) = std::min(
        // deletion
        v1.at(j + 1) + weight_delete,
        std::min(
          // insertion
          v2.at(j) + weight_insert,
          // substitution
          v1.at(j) + (weight_substitute * (lhsv.at(i) != rhsv.at(j)))));

      if (i > 0 && j > 0 &&
        (lhsv.at(i - 1) == rhsv.at(j)) &&
        (lhsv.at(i) == rhsv.at(j - 1)))
      {
        v2.at(j + 1) = std::min(
          v0.at(j + 1),
          // transposition
          v0.at(j - 1) + weight_transpose);
      }
    }

    std::swap(v0, v1);
    std::swap(v1, v2);
  }

  return v1.at(rhsv.size());
}